

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::Sequence::AddExpectation(Sequence *this,Expectation *expectation)

{
  bool bVar1;
  Expectation *this_00;
  linked_ptr<testing::internal::ExpectationBase> *plVar2;
  ExpectationSet *in_RSI;
  linked_ptr<testing::Expectation> *in_RDI;
  Expectation *in_stack_ffffffffffffffd8;
  Expectation *in_stack_ffffffffffffffe0;
  
  internal::linked_ptr<testing::Expectation>::operator*(in_RDI);
  bVar1 = Expectation::operator!=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar1) {
    this_00 = internal::linked_ptr<testing::Expectation>::operator->(in_RDI);
    plVar2 = Expectation::expectation_base(this_00);
    bVar1 = internal::linked_ptr<testing::internal::ExpectationBase>::operator!=
                      (plVar2,(ExpectationBase *)0x0);
    if (bVar1) {
      in_stack_ffffffffffffffe0 = internal::linked_ptr<testing::Expectation>::operator*(in_RDI);
      plVar2 = Expectation::expectation_base((Expectation *)in_RSI);
      internal::linked_ptr<testing::internal::ExpectationBase>::operator->(plVar2);
      ExpectationSet::operator+=(in_RSI,(Expectation *)in_RDI);
    }
    internal::linked_ptr<testing::Expectation>::operator*(in_RDI);
    Expectation::operator=(in_stack_ffffffffffffffe0,(Expectation *)in_RSI);
  }
  return;
}

Assistant:

void Sequence::AddExpectation(const Expectation& expectation) const {
  if (*last_expectation_ != expectation) {
    if (last_expectation_->expectation_base() != NULL) {
      expectation.expectation_base()->immediate_prerequisites_
          += *last_expectation_;
    }
    *last_expectation_ = expectation;
  }
}